

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSemaphoreUnix.c
# Opt level: O0

deSemaphore deSemaphore_create(int initialValue,deSemaphoreAttributes *attributes)

{
  int iVar1;
  sem_t *sem;
  deSemaphoreAttributes *attributes_local;
  sem_t *psStack_10;
  int initialValue_local;
  
  psStack_10 = (sem_t *)deMalloc(0x20);
  if (psStack_10 == (sem_t *)0x0) {
    psStack_10 = (sem_t *)0x0;
  }
  else {
    iVar1 = sem_init(psStack_10,0,initialValue);
    if (iVar1 != 0) {
      deFree(psStack_10);
      psStack_10 = (sem_t *)0x0;
    }
  }
  return (deSemaphore)psStack_10;
}

Assistant:

deSemaphore deSemaphore_create (int initialValue, const deSemaphoreAttributes* attributes)
{
	sem_t*	sem	= (sem_t*)deMalloc(sizeof(sem_t));

	DE_UNREF(attributes);
	DE_ASSERT(initialValue >= 0);

	if (!sem)
		return 0;

	if (sem_init(sem, 0, (unsigned int)initialValue) != 0)
	{
		deFree(sem);
		return 0;
	}

	return (deSemaphore)sem;
}